

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

DoubleParameter * __thiscall
CoreML::Specification::SGDOptimizer::mutable_momentum(SGDOptimizer *this)

{
  DoubleParameter *this_00;
  SGDOptimizer *this_local;
  
  if (this->momentum_ == (DoubleParameter *)0x0) {
    this_00 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(this_00);
    this->momentum_ = this_00;
  }
  return this->momentum_;
}

Assistant:

inline ::CoreML::Specification::DoubleParameter* SGDOptimizer::mutable_momentum() {
  
  if (momentum_ == NULL) {
    momentum_ = new ::CoreML::Specification::DoubleParameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SGDOptimizer.momentum)
  return momentum_;
}